

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O1

void ucnv_toUWriteUChars_63
               (UConverter *cnv,UChar *uchars,int32_t length,UChar **target,UChar *targetLimit,
               int32_t **offsets,int32_t sourceIndex,UErrorCode *pErrorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  long lVar3;
  int32_t iVar4;
  int iVar5;
  int32_t *piVar6;
  
  pUVar2 = *target;
  if ((offsets == (int32_t **)0x0) || (piVar6 = *offsets, piVar6 == (int32_t *)0x0)) {
    iVar4 = length;
    if (pUVar2 < targetLimit && 0 < length) {
      do {
        UVar1 = *uchars;
        uchars = uchars + 1;
        *pUVar2 = UVar1;
        pUVar2 = pUVar2 + 1;
        length = iVar4 + -1;
        if (iVar4 < 2) break;
        iVar4 = length;
      } while (pUVar2 < targetLimit);
    }
  }
  else {
    iVar4 = length;
    if (pUVar2 < targetLimit && 0 < length) {
      do {
        UVar1 = *uchars;
        uchars = uchars + 1;
        *pUVar2 = UVar1;
        pUVar2 = pUVar2 + 1;
        *piVar6 = sourceIndex;
        piVar6 = piVar6 + 1;
        iVar4 = length + -1;
        if (length < 2) break;
        length = iVar4;
      } while (pUVar2 < targetLimit);
    }
    *offsets = piVar6;
    length = iVar4;
  }
  *target = pUVar2;
  if (0 < length) {
    if (cnv != (UConverter *)0x0) {
      cnv->UCharErrorBufferLength = (int8_t)length;
      iVar5 = length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)cnv->UCharErrorBuffer + lVar3) = *(undefined2 *)((long)uchars + lVar3)
        ;
        iVar5 = iVar5 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < iVar5);
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteUChars(UConverter *cnv,
                    const UChar *uchars, int32_t length,
                    UChar **target, const UChar *targetLimit,
                    int32_t **offsets,
                    int32_t sourceIndex,
                    UErrorCode *pErrorCode) {
    UChar *t=*target;
    int32_t *o;

    /* write UChars */
    if(offsets==NULL || (o=*offsets)==NULL) {
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            --length;
        }
    } else {
        /* output with offsets */
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            *o++=sourceIndex;
            --length;
        }
        *offsets=o;
    }
    *target=t;

    /* write overflow */
    if(length>0) {
        if(cnv!=NULL) {
            t=cnv->UCharErrorBuffer;
            cnv->UCharErrorBufferLength=(int8_t)length;
            do {
                *t++=*uchars++;
            } while(--length>0);
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}